

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm_sse2.c
# Opt level: O3

void av1_lowbd_fwd_txfm2d_4x8_sse2(int16_t *input,int32_t *output,int stride,TX_TYPE tx_type,int bd)

{
  int *piVar1;
  byte bVar2;
  code *pcVar3;
  code *pcVar4;
  undefined8 uVar5;
  undefined1 auVar6 [12];
  undefined1 auVar7 [12];
  undefined1 auVar8 [12];
  undefined1 auVar9 [12];
  bool bVar10;
  int8_t *piVar11;
  uint uVar12;
  uint uVar13;
  undefined7 in_register_00000009;
  long lVar14;
  undefined8 *puVar15;
  undefined8 *puVar16;
  undefined1 auVar17 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar31 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  __m128i buf0 [8];
  __m128i buf1 [8];
  undefined8 auStack_148 [2];
  undefined1 local_138 [8];
  undefined8 uStack_130;
  undefined2 local_128;
  undefined2 uStack_126;
  undefined2 uStack_124;
  undefined2 uStack_122;
  undefined1 local_118 [12];
  undefined2 local_108;
  undefined2 uStack_106;
  undefined2 uStack_104;
  undefined2 uStack_102;
  undefined1 local_f8 [12];
  undefined2 local_e8;
  undefined2 uStack_e6;
  undefined2 uStack_e4;
  undefined2 uStack_e2;
  undefined1 local_d8 [12];
  undefined2 local_c8;
  undefined2 uStack_c6;
  undefined2 uStack_c4;
  undefined2 uStack_c2;
  undefined8 local_b8 [5];
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined8 local_88;
  undefined4 uStack_78;
  undefined4 uStack_74;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar38 [16];
  undefined1 auVar37 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  
  piVar11 = av1_fwd_txfm_shift_ls[5];
  puVar16 = (undefined8 *)local_138;
  uVar13 = (uint)CONCAT71(in_register_00000009,tx_type);
  bVar10 = false;
  if (uVar13 < 0x10) {
    if ((0x4110U >> (uVar13 & 0x1f) & 1) != 0) {
LAB_004b94ef:
      lVar14 = 0x80;
      do {
        *(undefined8 *)((long)auStack_148 + lVar14) = *(undefined8 *)input;
        *(undefined8 *)(local_138 + lVar14 + -8) = 0;
        input = input + stride;
        lVar14 = lVar14 + -0x10;
      } while (lVar14 != 0);
      goto LAB_004b950d;
    }
    if ((0x80a0U >> (uVar13 & 0x1f) & 1) == 0) {
      if (uVar13 == 6) {
        bVar10 = true;
        goto LAB_004b94ef;
      }
    }
    else {
      bVar10 = true;
    }
  }
  lVar14 = 0;
  do {
    *(undefined8 *)(local_138 + lVar14) = *(undefined8 *)input;
    *(undefined8 *)((long)&uStack_130 + lVar14) = 0;
    lVar14 = lVar14 + 0x10;
    input = input + stride;
  } while (lVar14 != 0x80);
LAB_004b950d:
  pcVar3 = *(code **)((long)col_txfm4x8_arr + (ulong)(uVar13 * 8));
  bVar2 = *av1_fwd_txfm_shift_ls[5];
  uVar12 = (uint)(char)bVar2;
  if ((int)uVar12 < 0) {
    auVar22 = ZEXT416((uint)(1 << (~bVar2 & 0x1f)));
    auVar22 = pshuflw(auVar22,auVar22,0);
    auVar22._4_4_ = auVar22._0_4_;
    auVar22._8_4_ = auVar22._0_4_;
    auVar22._12_4_ = auVar22._0_4_;
    lVar14 = 0;
    do {
      auVar26 = paddsw(*(undefined1 (*) [16])(local_138 + lVar14),auVar22);
      auVar26 = psraw(auVar26,ZEXT416(-uVar12));
      *(undefined1 (*) [16])(local_138 + lVar14) = auVar26;
      lVar14 = lVar14 + 0x10;
    } while (lVar14 != 0x80);
  }
  else if (bVar2 != 0) {
    lVar14 = 0;
    do {
      auVar22 = psllw(*(undefined1 (*) [16])(local_138 + lVar14),ZEXT416(uVar12));
      *(undefined1 (*) [16])(local_138 + lVar14) = auVar22;
      lVar14 = lVar14 + 0x10;
    } while (lVar14 != 0x80);
  }
  pcVar4 = *(code **)((long)row_txfm8x4_arr + (ulong)(uVar13 * 8));
  auStack_148[1] = 0x4b95a7;
  (*pcVar3)(local_138,local_138,0xd);
  bVar2 = piVar11[1];
  uVar13 = (uint)(char)bVar2;
  if ((int)uVar13 < 0) {
    auVar22 = ZEXT416((uint)(1 << (~bVar2 & 0x1f)));
    auVar22 = pshuflw(auVar22,auVar22,0);
    auVar26._0_4_ = auVar22._0_4_;
    auVar26._4_4_ = auVar26._0_4_;
    auVar26._8_4_ = auVar26._0_4_;
    auVar26._12_4_ = auVar26._0_4_;
    lVar14 = 0;
    do {
      auVar22 = paddsw(*(undefined1 (*) [16])(local_138 + lVar14),auVar26);
      auVar22 = psraw(auVar22,ZEXT416(-uVar13));
      *(undefined1 (*) [16])(local_138 + lVar14) = auVar22;
      lVar14 = lVar14 + 0x10;
    } while (lVar14 != 0x80);
  }
  else if (bVar2 != 0) {
    lVar14 = 0;
    do {
      auVar22 = psllw(*(undefined1 (*) [16])(local_138 + lVar14),ZEXT416(uVar13));
      *(undefined1 (*) [16])(local_138 + lVar14) = auVar22;
      lVar14 = lVar14 + 0x10;
    } while (lVar14 != 0x80);
  }
  auVar41._12_2_ = local_138._6_2_;
  auVar41._0_12_ = _local_138;
  auVar41._14_2_ = uStack_122;
  auVar19._12_4_ = auVar41._12_4_;
  auVar19._0_10_ = local_138._0_10_;
  auVar19._10_2_ = uStack_124;
  auVar18._10_6_ = auVar19._10_6_;
  auVar18._0_8_ = local_138;
  auVar18._8_2_ = local_138._4_2_;
  auVar6._4_8_ = auVar18._8_8_;
  auVar6._2_2_ = uStack_126;
  auVar6._0_2_ = local_138._2_2_;
  auVar17._0_4_ = CONCAT22(local_128,local_138._0_2_);
  auVar17._4_12_ = auVar6;
  auVar25._12_2_ = local_118._6_2_;
  auVar25._0_12_ = local_118;
  auVar25._14_2_ = uStack_102;
  auVar24._12_4_ = auVar25._12_4_;
  auVar24._0_10_ = local_118._0_10_;
  auVar24._10_2_ = uStack_104;
  auVar23._10_6_ = auVar24._10_6_;
  auVar23._0_8_ = local_118._0_8_;
  auVar23._8_2_ = local_118._4_2_;
  auVar7._4_8_ = auVar23._8_8_;
  auVar7._2_2_ = uStack_106;
  auVar7._0_2_ = local_118._2_2_;
  auVar30._12_2_ = local_f8._6_2_;
  auVar30._0_12_ = local_f8;
  auVar30._14_2_ = uStack_e2;
  auVar29._12_4_ = auVar30._12_4_;
  auVar29._0_10_ = local_f8._0_10_;
  auVar29._10_2_ = uStack_e4;
  auVar28._10_6_ = auVar29._10_6_;
  auVar28._0_8_ = local_f8._0_8_;
  auVar28._8_2_ = local_f8._4_2_;
  auVar8._4_8_ = auVar28._8_8_;
  auVar8._2_2_ = uStack_e6;
  auVar8._0_2_ = local_f8._2_2_;
  auVar27._0_4_ = CONCAT22(local_e8,local_f8._0_2_);
  auVar27._4_12_ = auVar8;
  auVar33._12_2_ = local_d8._6_2_;
  auVar33._0_12_ = local_d8;
  auVar33._14_2_ = uStack_c2;
  auVar32._12_4_ = auVar33._12_4_;
  auVar32._0_10_ = local_d8._0_10_;
  auVar32._10_2_ = uStack_c4;
  auVar31._10_6_ = auVar32._10_6_;
  auVar31._0_8_ = local_d8._0_8_;
  auVar31._8_2_ = local_d8._4_2_;
  auVar9._4_8_ = auVar31._8_8_;
  auVar9._2_2_ = uStack_c6;
  auVar9._0_2_ = local_d8._2_2_;
  auVar35._0_8_ = auVar17._0_8_;
  auVar35._8_4_ = auVar6._0_4_;
  auVar35._12_4_ = auVar7._0_4_;
  auVar42._0_8_ = auVar27._0_8_;
  auVar42._8_4_ = auVar8._0_4_;
  auVar42._12_4_ = auVar9._0_4_;
  auVar20._0_8_ = CONCAT44(auVar23._8_4_,auVar18._8_4_);
  auVar20._8_4_ = auVar19._12_4_;
  auVar20._12_4_ = auVar24._12_4_;
  local_b8[0] = CONCAT44(CONCAT22(local_108,local_118._0_2_),auVar17._0_4_);
  local_b8[1] = CONCAT44(CONCAT22(local_c8,local_d8._0_2_),auVar27._0_4_);
  local_b8[2] = auVar35._8_8_;
  local_b8[3] = auVar42._8_8_;
  local_b8[4] = auVar20._0_8_;
  uStack_90 = auVar28._8_4_;
  uStack_8c = auVar31._8_4_;
  local_88 = auVar20._8_8_;
  uStack_78 = auVar29._12_4_;
  uStack_74 = auVar32._12_4_;
  if (bVar10) {
    lVar14 = 0x40;
    puVar15 = local_b8;
    do {
      uVar5 = puVar15[1];
      *(undefined8 *)((long)auStack_148 + lVar14) = *puVar15;
      *(undefined8 *)(local_138 + lVar14 + -8) = uVar5;
      puVar15 = puVar15 + 2;
      lVar14 = lVar14 + -0x10;
    } while (lVar14 != 0);
  }
  else {
    puVar16 = local_b8;
  }
  auStack_148[1] = 0x4b96d7;
  (*pcVar4)(puVar16,puVar16,0xd);
  auVar22 = _DAT_005690c0;
  bVar2 = piVar11[2];
  if ((char)bVar2 < '\0') {
    auVar26 = ZEXT416((uint)(1 << (~bVar2 & 0x1f)));
    auVar26 = pshuflw(auVar26,auVar26,0);
    auVar21._0_4_ = auVar26._0_4_;
    auVar21._4_4_ = auVar21._0_4_;
    auVar21._8_4_ = auVar21._0_4_;
    auVar21._12_4_ = auVar21._0_4_;
    lVar14 = 0;
    do {
      auVar26 = paddsw(*(undefined1 (*) [16])((long)puVar16 + lVar14),auVar21);
      auVar26 = psraw(auVar26,ZEXT416((uint)-(int)(char)bVar2));
      *(undefined1 (*) [16])((long)puVar16 + lVar14) = auVar26;
      lVar14 = lVar14 + 0x10;
    } while (lVar14 != 0x40);
  }
  else if (bVar2 != 0) {
    lVar14 = 0;
    do {
      auVar26 = psllw(*(undefined1 (*) [16])((long)puVar16 + lVar14),ZEXT416((uint)(int)(char)bVar2)
                     );
      *(undefined1 (*) [16])((long)puVar16 + lVar14) = auVar26;
      lVar14 = lVar14 + 0x10;
    } while (lVar14 != 0x40);
  }
  lVar14 = 0;
  do {
    auVar26 = *(undefined1 (*) [16])((long)puVar16 + lVar14);
    auVar40._0_12_ = auVar26._0_12_;
    auVar40._12_2_ = auVar26._6_2_;
    auVar40._14_2_ = 1;
    auVar39._12_4_ = auVar40._12_4_;
    auVar39._0_10_ = auVar26._0_10_;
    auVar39._10_2_ = 1;
    auVar38._10_6_ = auVar39._10_6_;
    auVar38._0_8_ = auVar26._0_8_;
    auVar38._8_2_ = auVar26._4_2_;
    auVar37._8_8_ = auVar38._8_8_;
    auVar37._0_8_ = 0x1000000000000;
    auVar36._6_10_ = auVar37._6_10_;
    auVar36._4_2_ = auVar26._2_2_;
    auVar36._0_2_ = auVar26._0_2_;
    auVar36._2_2_ = 1;
    auVar34._2_2_ = 0;
    auVar34._0_2_ = auVar26._8_2_;
    auVar34._4_2_ = auVar26._10_2_;
    auVar34._6_2_ = 0;
    auVar34._8_2_ = auVar26._12_2_;
    auVar34._10_2_ = 0;
    auVar34._12_2_ = auVar26._14_2_;
    auVar34._14_2_ = 1;
    auVar41 = pmaddwd(auVar36,auVar22);
    auVar26 = pmaddwd(auVar34,auVar22);
    piVar1 = (int *)((long)output + lVar14 * 2);
    *piVar1 = auVar41._0_4_ >> 0xc;
    piVar1[1] = auVar41._4_4_ >> 0xc;
    piVar1[2] = auVar41._8_4_ >> 0xc;
    piVar1[3] = auVar41._12_4_ >> 0xc;
    piVar1 = (int *)((long)output + lVar14 * 2 + 0x10);
    *piVar1 = auVar26._0_4_ >> 0xc;
    piVar1[1] = auVar26._4_4_ >> 0xc;
    piVar1[2] = auVar26._8_4_ >> 0xc;
    piVar1[3] = auVar26._12_4_ >> 0xc;
    lVar14 = lVar14 + 0x10;
  } while (lVar14 != 0x40);
  return;
}

Assistant:

void av1_lowbd_fwd_txfm2d_4x8_sse2(const int16_t *input, int32_t *output,
                                   int stride, TX_TYPE tx_type, int bd) {
  (void)stride;
  (void)bd;
  __m128i buf0[8], buf1[8], *buf;
  const int8_t *shift = av1_fwd_txfm_shift_ls[TX_4X8];
  const int txw_idx = get_txw_idx(TX_4X8);
  const int txh_idx = get_txh_idx(TX_4X8);
  const int cos_bit_col = av1_fwd_cos_bit_col[txw_idx][txh_idx];
  const int cos_bit_row = av1_fwd_cos_bit_row[txw_idx][txh_idx];
  const int width = 4;
  const int height = 8;
  const transform_1d_sse2 col_txfm = col_txfm4x8_arr[tx_type];
  const transform_1d_sse2 row_txfm = row_txfm8x4_arr[tx_type];
  int ud_flip, lr_flip;

  get_flip_cfg(tx_type, &ud_flip, &lr_flip);
  if (ud_flip) {
    load_buffer_16bit_to_16bit_w4_flip(input, stride, buf0, height);
  } else {
    load_buffer_16bit_to_16bit_w4(input, stride, buf0, height);
  }
  round_shift_16bit(buf0, height, shift[0]);
  col_txfm(buf0, buf0, cos_bit_col);
  round_shift_16bit(buf0, height, shift[1]);
  transpose_16bit_4x8(buf0, buf1);

  if (lr_flip) {
    buf = buf0;
    flip_buf_sse2(buf1, buf, width);
  } else {
    buf = buf1;
  }
  row_txfm(buf, buf, cos_bit_row);
  round_shift_16bit(buf, width, shift[2]);
  store_rect_buffer_16bit_to_32bit_w8(buf, output, height, width);
}